

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

int libssh2_userauth_keyboard_interactive_ex
              (LIBSSH2_SESSION *session,char *user,uint user_len,
              _func_void_char_ptr_int_char_ptr_int_int_LIBSSH2_USERAUTH_KBDINT_PROMPT_ptr_LIBSSH2_USERAUTH_KBDINT_RESPONSE_ptr_void_ptr_ptr
              *response_callback)

{
  int iVar1;
  time_t start_time;
  time_t entry_time;
  int rc;
  _func_void_char_ptr_int_char_ptr_int_int_LIBSSH2_USERAUTH_KBDINT_PROMPT_ptr_LIBSSH2_USERAUTH_KBDINT_RESPONSE_ptr_void_ptr_ptr
  *response_callback_local;
  uint user_len_local;
  char *user_local;
  LIBSSH2_SESSION *session_local;
  
  start_time = time((time_t *)0x0);
  do {
    iVar1 = userauth_keyboard_interactive(session,user,user_len,response_callback);
    if (iVar1 != -0x25) {
      return iVar1;
    }
    if (session == (LIBSSH2_SESSION *)0x0) {
      return -0x25;
    }
    if (session->api_block_mode == 0) {
      return -0x25;
    }
    iVar1 = _libssh2_wait_socket(session,start_time);
  } while (iVar1 == 0);
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_userauth_keyboard_interactive_ex(LIBSSH2_SESSION *session,
                                         const char *user,
                                         unsigned int user_len,
                                         LIBSSH2_USERAUTH_KBDINT_RESPONSE_FUNC
                                             ((*response_callback)))
{
    int rc;
    BLOCK_ADJUST(rc, session,
                 userauth_keyboard_interactive(session, user, user_len,
                                               response_callback));
    return rc;
}